

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

DecimalFormat * __thiscall
icu_63::DecimalFormat::setAttribute
          (DecimalFormat *this,UNumberFormatAttribute attr,int32_t newValue,UErrorCode *status)

{
  DecimalFormatProperties *pDVar1;
  char cVar2;
  
  if (U_ZERO_ERROR < *status) {
    return this;
  }
  switch(attr) {
  case UNUM_PARSE_INT_ONLY:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x17])
              (this,(ulong)(newValue != 0));
    break;
  case UNUM_GROUPING_USED:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x1a])
              (this,(ulong)(newValue != 0));
    break;
  case UNUM_DECIMAL_ALWAYS_SHOWN:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x45])
              (this,(ulong)(newValue != 0));
    break;
  case UNUM_MIN_INTEGER_DIGITS:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x1c])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_INTEGER_DIGITS:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x1c])
              (this,(ulong)(uint)newValue);
  case UNUM_MAX_INTEGER_DIGITS:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x1b])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_MIN_FRACTION_DIGITS:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x1e])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_FRACTION_DIGITS:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x1e])
              (this,(ulong)(uint)newValue);
  case UNUM_MAX_FRACTION_DIGITS:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x1d])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_MULTIPLIER:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x32])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_GROUPING_SIZE:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x42])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_ROUNDING_MODE:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x23])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_ROUNDING_INCREMENT:
switchD_002da7ae_caseD_c:
    *status = U_UNSUPPORTED_ERROR;
    break;
  case UNUM_FORMAT_WIDTH:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x37])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_PADDING_POSITION:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x3b])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_SECONDARY_GROUPING_SIZE:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x43])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_SIGNIFICANT_DIGITS_USED:
    setSignificantDigitsUsed(this,newValue != 0);
    break;
  case UNUM_MIN_SIGNIFICANT_DIGITS:
    setMinimumSignificantDigits(this,newValue);
    break;
  case UNUM_MAX_SIGNIFICANT_DIGITS:
    setMaximumSignificantDigits(this,newValue);
    break;
  case UNUM_LENIENT_PARSE:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x18])
              (this,(ulong)(newValue != 0));
    break;
  case UNUM_PARSE_ALL_INPUT:
    pDVar1 = (this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    if (pDVar1->parseAllInput != newValue) {
      pDVar1->parseAllInput = newValue;
    }
    break;
  case UNUM_SCALE:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x33])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_MINIMUM_GROUPING_DIGITS:
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x44])
              (this,(ulong)(uint)newValue);
    break;
  case UNUM_CURRENCY_USAGE:
    setCurrencyUsage(this,newValue,status);
    break;
  default:
    cVar2 = (char)newValue;
    switch(attr) {
    case UNUM_FORMAT_FAIL_IF_MORE_THAN_MAX_DIGITS:
      (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x4c])
                (this,(ulong)(uint)(int)cVar2);
      break;
    case UNUM_PARSE_NO_EXPONENT:
      (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x48])
                (this,(ulong)(uint)(int)cVar2);
      break;
    case UNUM_PARSE_DECIMAL_MARK_REQUIRED:
      (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x46])
                (this,(ulong)(uint)(int)cVar2);
      break;
    default:
      goto switchD_002da7ae_caseD_c;
    case UNUM_PARSE_CASE_SENSITIVE:
      (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x4a])
                (this,(ulong)(uint)(int)cVar2);
      break;
    case UNUM_SIGN_ALWAYS_SHOWN:
      (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x31])
                (this,(ulong)(uint)(int)cVar2);
    }
  }
  return this;
}

Assistant:

DecimalFormat&
DecimalFormat::setAttribute(UNumberFormatAttribute attr, int32_t newValue, UErrorCode& status) {
    if (U_FAILURE(status)) { return *this; }

    switch (attr) {
        case UNUM_LENIENT_PARSE:
            setLenient(newValue != 0);
            break;

        case UNUM_PARSE_INT_ONLY:
            setParseIntegerOnly(newValue != 0);
            break;

        case UNUM_GROUPING_USED:
            setGroupingUsed(newValue != 0);
            break;

        case UNUM_DECIMAL_ALWAYS_SHOWN:
            setDecimalSeparatorAlwaysShown(newValue != 0);
            break;

        case UNUM_MAX_INTEGER_DIGITS:
            setMaximumIntegerDigits(newValue);
            break;

        case UNUM_MIN_INTEGER_DIGITS:
            setMinimumIntegerDigits(newValue);
            break;

        case UNUM_INTEGER_DIGITS:
            setMinimumIntegerDigits(newValue);
            setMaximumIntegerDigits(newValue);
            break;

        case UNUM_MAX_FRACTION_DIGITS:
            setMaximumFractionDigits(newValue);
            break;

        case UNUM_MIN_FRACTION_DIGITS:
            setMinimumFractionDigits(newValue);
            break;

        case UNUM_FRACTION_DIGITS:
            setMinimumFractionDigits(newValue);
            setMaximumFractionDigits(newValue);
            break;

        case UNUM_SIGNIFICANT_DIGITS_USED:
            setSignificantDigitsUsed(newValue != 0);
            break;

        case UNUM_MAX_SIGNIFICANT_DIGITS:
            setMaximumSignificantDigits(newValue);
            break;

        case UNUM_MIN_SIGNIFICANT_DIGITS:
            setMinimumSignificantDigits(newValue);
            break;

        case UNUM_MULTIPLIER:
            setMultiplier(newValue);
            break;

        case UNUM_SCALE:
            setMultiplierScale(newValue);
            break;

        case UNUM_GROUPING_SIZE:
            setGroupingSize(newValue);
            break;

        case UNUM_ROUNDING_MODE:
            setRoundingMode((DecimalFormat::ERoundingMode) newValue);
            break;

        case UNUM_FORMAT_WIDTH:
            setFormatWidth(newValue);
            break;

        case UNUM_PADDING_POSITION:
            /** The position at which padding will take place. */
            setPadPosition((DecimalFormat::EPadPosition) newValue);
            break;

        case UNUM_SECONDARY_GROUPING_SIZE:
            setSecondaryGroupingSize(newValue);
            break;

#if UCONFIG_HAVE_PARSEALLINPUT
        case UNUM_PARSE_ALL_INPUT:
            setParseAllInput((UNumberFormatAttributeValue) newValue);
            break;
#endif

        case UNUM_PARSE_NO_EXPONENT:
            setParseNoExponent((UBool) newValue);
            break;

        case UNUM_PARSE_DECIMAL_MARK_REQUIRED:
            setDecimalPatternMatchRequired((UBool) newValue);
            break;

        case UNUM_CURRENCY_USAGE:
            setCurrencyUsage((UCurrencyUsage) newValue, &status);
            break;

        case UNUM_MINIMUM_GROUPING_DIGITS:
            setMinimumGroupingDigits(newValue);
            break;

        case UNUM_PARSE_CASE_SENSITIVE:
            setParseCaseSensitive(static_cast<UBool>(newValue));
            break;

        case UNUM_SIGN_ALWAYS_SHOWN:
            setSignAlwaysShown(static_cast<UBool>(newValue));
            break;

        case UNUM_FORMAT_FAIL_IF_MORE_THAN_MAX_DIGITS:
            setFormatFailIfMoreThanMaxDigits(static_cast<UBool>(newValue));
            break;

        default:
            status = U_UNSUPPORTED_ERROR;
            break;
    }
    return *this;
}